

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

void decSetOverflow(decNumber *dn,decContext *set,uint32_t *status)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  
  if ((dn->lsu[0] == '\0') && ((dn->bits & 0x70) == 0 && dn->digits == 1)) {
    iVar1 = set->emax;
    if (set->clamp != '\0') {
      iVar1 = (iVar1 - set->digits) + 1;
    }
    if (dn->exponent <= iVar1) {
      return;
    }
    dn->exponent = iVar1;
    uVar2 = 0x400;
    goto LAB_0024c778;
  }
  bVar3 = dn->bits & 0x80;
  dn->bits = '\0';
  dn->lsu[0] = '\0';
  dn->digits = 1;
  dn->exponent = 0;
  switch(set->round) {
  case DEC_ROUND_CEILING:
    bVar4 = bVar3 == 0;
    break;
  default:
    goto switchD_0024c74d_caseD_1;
  case DEC_ROUND_DOWN:
  case DEC_ROUND_05UP:
    goto switchD_0024c74d_caseD_5;
  case DEC_ROUND_FLOOR:
    bVar4 = bVar3 != 0;
  }
  if (bVar4) {
switchD_0024c74d_caseD_1:
    bVar3 = bVar3 | 0x40;
  }
  else {
switchD_0024c74d_caseD_5:
    decSetMaxValue(dn,set);
  }
  dn->bits = bVar3;
  uVar2 = 0xa20;
LAB_0024c778:
  *status = *status | uVar2;
  return;
}

Assistant:

static void decSetOverflow(decNumber *dn, decContext *set, uInt *status) {
  Flag needmax=0;                  /* result is maximum finite value  */
  uByte sign=dn->bits&DECNEG;      /* clean and save sign bit  */

  if (ISZERO(dn)) {                /* zero does not overflow magnitude  */
    Int emax=set->emax;                      /* limit value  */
    if (set->clamp) emax-=set->digits-1;     /* lower if clamping  */
    if (dn->exponent>emax) {                 /* clamp required  */
      dn->exponent=emax;
      *status|=DEC_Clamped;
      }
    return;
    }

  uprv_decNumberZero(dn);
  switch (set->round) {
    case DEC_ROUND_DOWN: {
      needmax=1;                   /* never Infinity  */
      break;} /* r-d  */
    case DEC_ROUND_05UP: {
      needmax=1;                   /* never Infinity  */
      break;} /* r-05  */
    case DEC_ROUND_CEILING: {
      if (sign) needmax=1;         /* Infinity if non-negative  */
      break;} /* r-c  */
    case DEC_ROUND_FLOOR: {
      if (!sign) needmax=1;        /* Infinity if negative  */
      break;} /* r-f  */
    default: break;                /* Infinity in all other cases  */
    }
  if (needmax) {
    decSetMaxValue(dn, set);
    dn->bits=sign;                 /* set sign  */
    }
   else dn->bits=sign|DECINF;      /* Value is +/-Infinity  */
  *status|=DEC_Overflow | DEC_Inexact | DEC_Rounded;
  }